

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserLibxmlSaxParser.cpp
# Opt level: O3

void GeneratedSaxParser::LibxmlSaxParser::errorFunction(void *userData,char *msg,...)

{
  long *plVar1;
  char in_AL;
  char *pcVar2;
  undefined8 in_RCX;
  char *in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  allocator<char> local_159;
  va_list argList;
  String local_138;
  ParserError error;
  undefined1 local_c8 [16];
  char *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (((*msg == '%') && (msg[1] == 's')) && (msg[2] == '\0')) {
    argList[0].reg_save_area = local_c8;
    argList[0].overflow_arg_area = &stack0x00000008;
    argList[0].gp_offset = 0x18;
    argList[0].fp_offset = 0x30;
    pcVar2 = in_RDX;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  if (pcVar2 != (char *)0x0) {
    msg = pcVar2;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,msg,&local_159);
  ParserError::ParserError
            (&error,SEVERITY_CRITICAL,ERROR_XML_PARSER_ERROR,(char *)0x0,(char *)0x0,0,0,&local_138)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  plVar1 = *(long **)(*(long *)((long)userData + 8) + 0x10);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 0x10))(plVar1,&error);
  }
  ParserError::~ParserError(&error);
  return;
}

Assistant:

void LibxmlSaxParser::errorFunction( void *userData, const char *msg, ... )
	{
        // if msg is just one string, get it. Otherwise ignore it.
        char* message = 0;
        va_list argList;
        if (strcmp(msg, "%s") == 0)
        {
            va_start(argList, msg); 
            message = va_arg(argList, char*);
        }

		LibxmlSaxParser* thisObject = (LibxmlSaxParser*)(userData);
		ParserError error(ParserError::SEVERITY_CRITICAL,
					ParserError::ERROR_XML_PARSER_ERROR,
					0,
					0,
					0,
					0,
                    message != 0 ? message : msg);

        if (message != 0)
        {
            va_end(argList);
        }

        IErrorHandler* errHandler = thisObject->getParser()->getErrorHandler();
        if ( errHandler ) 
            errHandler->handleError(error);
	}